

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

int ma_device__jack_process_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  ma_pcm_rb *pRB;
  long lVar1;
  ma_uint64 mVar2;
  ma_result mVar3;
  ma_int32 mVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  void *pvVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  void *pvVar12;
  long lVar13;
  char *message;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ma_uint32 mVar17;
  ulong uVar18;
  int local_107c;
  void *local_1078;
  void *local_1068;
  ma_uint64 framesProcessedInClientFormat;
  ma_uint32 framesToProcessInClientFormat;
  ma_data_converter *local_1050;
  ma_pcm_rb *local_1048;
  ma_data_converter *local_1040;
  ma_uint64 framesProcessedInDeviceFormat;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515a,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  lVar1 = *pUserData;
  if (lVar1 == 0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515d,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  uVar9 = *(uint *)((long)pUserData + 8);
  if ((uVar9 & 0xfffffffe) == 2) {
    for (uVar18 = 0; uVar18 < *(uint *)((long)pUserData + 0x2bcc); uVar18 = uVar18 + 1) {
      lVar7 = (**(code **)(lVar1 + 0x180))
                        (*(undefined8 *)((long)pUserData + uVar18 * 8 + 0x5478),frameCount);
      if (lVar7 != 0) {
        puVar11 = (undefined4 *)(uVar18 * 4 + *(long *)((long)pUserData + 0x5580));
        for (lVar13 = 0; frameCount != (ma_jack_nframes_t)lVar13; lVar13 = lVar13 + 1) {
          *puVar11 = *(undefined4 *)(lVar7 + lVar13 * 4);
          puVar11 = puVar11 + *(uint *)((long)pUserData + 0x2bcc);
        }
      }
    }
    pvVar8 = *(void **)((long)pUserData + 0x5580);
    if (*(int *)((long)pUserData + 8) == 3) {
      if (frameCount == 0) {
        __assert_fail("frameCountInDeviceFormat > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x2367,
                      "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                     );
      }
      if (pvVar8 == (void *)0x0) {
        __assert_fail("pFramesInDeviceFormat != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                      ,0x2368,
                      "ma_result ma_device__handle_duplex_callback_capture(ma_device *, ma_uint32, const void *, ma_pcm_rb *)"
                     );
      }
      pRB = (ma_pcm_rb *)((long)pUserData + 0x5588);
      local_1050 = (ma_data_converter *)((long)pUserData + 0x2c00);
      local_107c = 0;
      while( true ) {
        uVar9 = *(int *)(&DAT_001127b0 + (ulong)*(uint *)((long)pUserData + 0x2ba0) * 4) *
                *(int *)((long)pUserData + 0x2ba4);
        framesToProcessInClientFormat = 0x1000 / uVar9;
        mVar3 = ma_pcm_rb_acquire_write(pRB,&framesToProcessInClientFormat,&local_1068);
        if (mVar3 != 0) break;
        uVar18 = (ulong)framesToProcessInClientFormat;
        if ((uVar18 == 0) &&
           (uVar9 = ma_pcm_rb_pointer_distance(pRB),
           uVar9 == *(uint *)((long)pUserData + 0x5590) /
                    (uint)(*(int *)(&DAT_001127b0 + (ulong)*(uint *)((long)pUserData + 0x55c8) * 4)
                          * *(int *)((long)pUserData + 0x55cc)))) goto LAB_0010e3e4;
        framesProcessedInDeviceFormat = (ma_uint64)(frameCount - local_107c);
        pvVar12 = local_1068;
        framesProcessedInClientFormat = uVar18;
        mVar3 = ma_data_converter_process_pcm_frames
                          (local_1050,pvVar8,&framesProcessedInDeviceFormat,local_1068,
                           &framesProcessedInClientFormat);
        mVar2 = framesProcessedInDeviceFormat;
        uVar9 = (uint)pvVar12;
        if (mVar3 != 0) goto LAB_0010e3e4;
        mVar17 = (ma_uint32)framesProcessedInDeviceFormat;
        mVar3 = ma_pcm_rb_commit_write(pRB,mVar17,local_1068);
        if (mVar3 != 0) {
          message = "Failed to commit capture PCM frames to ring buffer.";
          goto LAB_0010e3d9;
        }
        if (framesProcessedInClientFormat == 0 && mVar2 == 0) goto LAB_0010e3e4;
        local_107c = local_107c + mVar17;
        pvVar8 = (void *)((long)pvVar8 +
                         mVar2 * (uint)(*(int *)((long)pUserData + 0x2bcc) *
                                       *(int *)(&DAT_001127b0 +
                                               (ulong)*(uint *)((long)pUserData + 0x2bc8) * 4)));
      }
      message = "Failed to acquire capture PCM frames from ring buffer.";
LAB_0010e3d9:
      ma_post_error((ma_device *)pUserData,1,message,uVar9);
    }
    else {
      ma_device__send_frames_to_client((ma_device *)pUserData,frameCount,pvVar8);
    }
LAB_0010e3e4:
    uVar9 = *(uint *)((long)pUserData + 8);
  }
  if (uVar9 == 1) {
    ma_device__read_frames_from_client
              ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5578));
  }
  else {
    if (uVar9 != 3) {
      return 0;
    }
    if (frameCount == 0) {
      __assert_fail("frameCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x23a3,
                    "ma_result ma_device__handle_duplex_callback_playback(ma_device *, ma_uint32, void *, ma_pcm_rb *)"
                   );
    }
    local_1078 = *(void **)((long)pUserData + 0x5578);
    if (local_1078 == (void *)0x0) {
      __assert_fail("pFramesInInternalFormat != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                    ,0x23a4,
                    "ma_result ma_device__handle_duplex_callback_playback(ma_device *, ma_uint32, void *, ma_pcm_rb *)"
                   );
    }
    local_1048 = (ma_pcm_rb *)((long)pUserData + 0x5588);
    local_1040 = (ma_data_converter *)((long)pUserData + 0x328);
    local_1050 = (ma_data_converter *)
                 ma_data_converter_get_required_input_frame_count(local_1040,(ulong)frameCount);
    uVar9 = 0;
    iVar16 = 0;
    while ((uVar14 = (uint)local_1050 - uVar9, uVar9 <= (uint)local_1050 && uVar14 != 0 &&
           (*(int *)((long)pUserData + 0x10) == 2))) {
      uVar15 = (uint)(0x1000 / (ulong)(uint)(*(int *)(&DAT_001127b0 +
                                                     (ulong)*(uint *)((long)pUserData + 0x2c8) * 4)
                                            * *(int *)((long)pUserData + 0x2cc)));
      if (uVar15 < uVar14) {
        uVar14 = uVar15;
      }
      uVar15 = *(int *)(&DAT_001127b0 + (ulong)*(uint *)((long)pUserData + 0x55c8) * 4) *
               *(int *)((long)pUserData + 0x55cc);
      if ((int)(*(uint *)((long)pUserData + 0x559c) ^ *(uint *)((long)pUserData + 0x55a0)) < 0) {
        uVar10 = *(uint *)((long)pUserData + 0x5590);
      }
      else {
        uVar10 = *(uint *)((long)pUserData + 0x55a0) & 0x7fffffff;
      }
      uVar10 = uVar10 - (*(uint *)((long)pUserData + 0x559c) & 0x7fffffff);
      if (uVar14 * uVar15 < uVar10) {
        uVar10 = uVar14 * uVar15;
      }
      pvVar8 = (void *)((ulong)(*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                       *(long *)((long)pUserData + 0x5588));
      mVar17 = (ma_uint32)((ulong)uVar10 / (ulong)uVar15);
      if (uVar10 < uVar15) {
        mVar4 = ma_pcm_rb_pointer_distance(local_1048);
        if (mVar4 == 0) break;
      }
      else {
        ma_device__on_data((ma_device *)pUserData,&framesProcessedInDeviceFormat,pvVar8,mVar17);
      }
      if ((void *)((ulong)(*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
                  *(long *)((long)pUserData + 0x5588)) != pvVar8) break;
      uVar14 = (*(uint *)((long)pUserData + 0x559c) & 0x7fffffff) +
               *(int *)((long)pUserData + 0x55cc) * mVar17 *
               *(int *)(&DAT_001127b0 + (ulong)*(uint *)((long)pUserData + 0x55c8) * 4);
      if (*(uint *)((long)pUserData + 0x5590) < uVar14) break;
      uVar5 = *(uint *)((long)pUserData + 0x559c) & 0x80000000;
      uVar6 = uVar5 ^ 0x80000000;
      if (uVar14 != *(uint *)((long)pUserData + 0x5590)) {
        uVar6 = uVar14 | uVar5;
      }
      LOCK();
      *(uint *)((long)pUserData + 0x559c) = uVar6;
      UNLOCK();
      local_1068 = (void *)(ulong)(frameCount - iVar16);
      framesProcessedInClientFormat = (ulong)uVar10 / (ulong)uVar15;
      ma_data_converter_process_pcm_frames
                (local_1040,&framesProcessedInDeviceFormat,&framesProcessedInClientFormat,local_1078
                 ,(ma_uint64 *)&local_1068);
      uVar9 = uVar9 + (int)framesProcessedInClientFormat;
      iVar16 = iVar16 + (int)local_1068;
      local_1078 = (void *)((long)local_1078 +
                           (ulong)(uint)(*(int *)(&DAT_001127b0 +
                                                 (ulong)*(uint *)((long)pUserData + 0x2f0) * 4) *
                                        *(int *)((long)pUserData + 0x2f4)) * (long)local_1068);
    }
  }
  for (uVar18 = 0; uVar18 < *(uint *)((long)pUserData + 0x2f4); uVar18 = uVar18 + 1) {
    lVar7 = (**(code **)(lVar1 + 0x180))
                      (*(undefined8 *)((long)pUserData + uVar18 * 8 + 0x5378),frameCount);
    if (lVar7 != 0) {
      puVar11 = (undefined4 *)(uVar18 * 4 + *(long *)((long)pUserData + 0x5578));
      for (lVar13 = 0; frameCount != (ma_jack_nframes_t)lVar13; lVar13 = lVar13 + 1) {
        *(undefined4 *)(lVar7 + lVar13 * 4) = *puVar11;
        puVar11 = puVar11 + *(uint *)((long)pUserData + 0x2f4);
      }
    }
  }
  return 0;
}

Assistant:

static int ma_device__jack_process_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice;
    ma_context* pContext;
    ma_uint32 iChannel;

    pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    pContext = pDevice->pContext;
    MA_ASSERT(pContext != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        /* Channels need to be interleaved. */
        for (iChannel = 0; iChannel < pDevice->capture.internalChannels; ++iChannel) {
            const float* pSrc = (const float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsCapture[iChannel], frameCount);
            if (pSrc != NULL) {
                float* pDst = pDevice->jack.pIntermediaryBufferCapture + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += pDevice->capture.internalChannels;
                    pSrc += 1;
                }
            }
        }

        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_capture(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture, &pDevice->jack.duplexRB);
        } else {
            ma_device__send_frames_to_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture);
        }
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_playback(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback, &pDevice->jack.duplexRB);
        } else {
            ma_device__read_frames_from_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback);
        }

        /* Channels need to be deinterleaved. */
        for (iChannel = 0; iChannel < pDevice->playback.internalChannels; ++iChannel) {
            float* pDst = (float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[iChannel], frameCount);
            if (pDst != NULL) {
                const float* pSrc = pDevice->jack.pIntermediaryBufferPlayback + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += 1;
                    pSrc += pDevice->playback.internalChannels;
                }
            }
        }
    }

    return 0;
}